

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int psbt_set_global_tx(wally_psbt *psbt,wally_tx *tx,_Bool do_clone)

{
  ulong uVar1;
  ulong uVar2;
  undefined4 uVar3;
  wally_psbt_input *local_58;
  ulong uStack_48;
  int ret;
  size_t i;
  wally_psbt_output *new_outputs;
  wally_psbt_input *new_inputs;
  wally_tx *new_tx;
  wally_psbt_input *pwStack_20;
  _Bool do_clone_local;
  wally_tx *tx_local;
  wally_psbt *psbt_local;
  
  new_inputs = (wally_psbt_input *)0x0;
  new_outputs = (wally_psbt_output *)0x0;
  i = 0;
  if ((((psbt == (wally_psbt *)0x0) || (psbt->tx != (wally_tx *)0x0)) || (psbt->num_inputs != 0)) ||
     ((psbt->num_outputs != 0 || (tx == (wally_tx *)0x0)))) {
    psbt_local._4_4_ = -2;
  }
  else {
    for (uStack_48 = 0; uStack_48 < tx->num_inputs; uStack_48 = uStack_48 + 1) {
      if ((tx->inputs[uStack_48].script != (uchar *)0x0) ||
         (tx->inputs[uStack_48].witness != (wally_tx_witness_stack *)0x0)) {
        return -2;
      }
    }
    new_tx._7_1_ = do_clone;
    pwStack_20 = (wally_psbt_input *)tx;
    tx_local = (wally_tx *)psbt;
    if ((!do_clone) ||
       (psbt_local._4_4_ = tx_clone_alloc(tx,(wally_tx **)&new_inputs), psbt_local._4_4_ == 0)) {
      if (tx_local->outputs < (wally_tx_output *)pwStack_20->redeem_script) {
        new_outputs = (wally_psbt_output *)wally_calloc((long)pwStack_20->redeem_script * 0x110);
      }
      uVar1._0_4_ = tx_local[1].version;
      uVar1._4_4_ = tx_local[1].locktime;
      if (uVar1 < pwStack_20->witness_script_len) {
        i = (size_t)wally_calloc(pwStack_20->witness_script_len * 0xd0);
      }
      if (((tx_local->outputs < (wally_tx_output *)pwStack_20->redeem_script) &&
          (new_outputs == (wally_psbt_output *)0x0)) ||
         ((uVar2._0_4_ = tx_local[1].version, uVar2._4_4_ = tx_local[1].locktime,
          uVar2 < pwStack_20->witness_script_len && (i == 0)))) {
        wally_free(new_outputs);
        wally_free((void *)i);
        wally_tx_free((wally_tx *)new_inputs);
        psbt_local._4_4_ = -3;
      }
      else {
        if (new_outputs != (wally_psbt_output *)0x0) {
          wally_free((void *)tx_local->num_inputs);
          tx_local->num_inputs = (size_t)new_outputs;
          tx_local->outputs = (wally_tx_output *)pwStack_20->redeem_script;
        }
        if (i != 0) {
          wally_free((void *)tx_local->num_outputs);
          tx_local->num_outputs = i;
          uVar3 = *(undefined4 *)((long)&pwStack_20->witness_script_len + 4);
          tx_local[1].version = *(undefined4 *)&pwStack_20->witness_script_len;
          tx_local[1].locktime = uVar3;
        }
        tx_local->inputs_allocation_len = (size_t)pwStack_20->redeem_script;
        tx_local->outputs_allocation_len = pwStack_20->witness_script_len;
        if ((new_tx._7_1_ & 1) == 0) {
          local_58 = pwStack_20;
        }
        else {
          local_58 = new_inputs;
        }
        tx_local->inputs = (wally_tx_input *)local_58;
        psbt_local._4_4_ = 0;
      }
    }
  }
  return psbt_local._4_4_;
}

Assistant:

static int psbt_set_global_tx(struct wally_psbt *psbt, struct wally_tx *tx, bool do_clone)
{
    struct wally_tx *new_tx = NULL;
    struct wally_psbt_input *new_inputs = NULL;
    struct wally_psbt_output *new_outputs = NULL;
    size_t i;
    int ret;

    if (!psbt || psbt->tx || psbt->num_inputs || psbt->num_outputs || !tx)
        return WALLY_EINVAL; /* PSBT must be completely empty */

    for (i = 0; i < tx->num_inputs; ++i)
        if (tx->inputs[i].script || tx->inputs[i].witness)
            return WALLY_EINVAL; /* tx mustn't have scriptSigs or witnesses */

    if (do_clone && (ret = tx_clone_alloc(tx, &new_tx)) != WALLY_OK)
        return ret;

    if (psbt->inputs_allocation_len < tx->num_inputs)
        new_inputs = wally_calloc(tx->num_inputs * sizeof(struct wally_psbt_input));

    if (psbt->outputs_allocation_len < tx->num_outputs)
        new_outputs = wally_calloc(tx->num_outputs * sizeof(struct wally_psbt_output));

    if ((psbt->inputs_allocation_len < tx->num_inputs && !new_inputs) ||
        (psbt->outputs_allocation_len < tx->num_outputs && !new_outputs)) {
        wally_free(new_inputs);
        wally_free(new_outputs);
        wally_tx_free(new_tx);
        return WALLY_ENOMEM;
    }

    if (new_inputs) {
        wally_free(psbt->inputs);
        psbt->inputs = new_inputs;
        psbt->inputs_allocation_len = tx->num_inputs;
    }
    if (new_outputs) {
        wally_free(psbt->outputs);
        psbt->outputs = new_outputs;
        psbt->outputs_allocation_len = tx->num_outputs;
    }
    psbt->num_inputs = tx->num_inputs;
    psbt->num_outputs = tx->num_outputs;
    psbt->tx = do_clone ? new_tx : tx;
    return WALLY_OK;
}